

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

substr __thiscall c4::yml::Parser::_finish_filter_arena(Parser *this,substr dst,size_t pos)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  ulong len_;
  substr sVar6;
  csubstr cVar7;
  char msg [42];
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  len_ = dst.len;
  if ((this->m_filter_arena).len < pos) {
    builtin_strncpy(msg,"check failed: (pos <= m_filter_arena.len)",0x2a);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        sVar6 = (substr)(*pcVar2)();
        return sVar6;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_38 = cVar7.len;
    pcStack_40 = cVar7.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f81) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f81) << 0x40,8);
    LVar3.name.str = pcStack_40;
    LVar3.name.len = local_38;
    (*p_Var1)(msg,0x2a,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  if (len_ < pos) {
    builtin_strncpy(msg,"check failed: (pos <= dst.len)",0x1f);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        sVar6 = (substr)(*pcVar2)();
        return sVar6;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_60 = cVar7.len;
    pcStack_68 = cVar7.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7f82) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7f82) << 0x40,8);
    LVar4.name.str = pcStack_68;
    LVar4.name.len = local_60;
    (*p_Var1)(msg,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  memcpy(dst.str,(this->m_filter_arena).str,pos);
  if (pos == 0xffffffffffffffff || pos <= len_) {
    if (pos != 0xffffffffffffffff) {
      len_ = pos;
    }
    basic_substring<char>::basic_substring((basic_substring<char> *)msg,dst.str,len_);
    sVar6.len._0_1_ = msg[8];
    sVar6.len._1_1_ = msg[9];
    sVar6.len._2_1_ = msg[10];
    sVar6.len._3_1_ = msg[0xb];
    sVar6.len._4_1_ = msg[0xc];
    sVar6.len._5_1_ = msg[0xd];
    sVar6.len._6_1_ = msg[0xe];
    sVar6.str = (char *)msg._0_8_;
    sVar6.len._7_1_ = msg[0xf];
    return sVar6;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar5 = is_debugger_attached();
    if (bVar5) {
      pcVar2 = (code *)swi(3);
      sVar6 = (substr)(*pcVar2)();
      return sVar6;
    }
  }
  handle_error(0x1e5106,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x154e,"num <= len || num == npos");
}

Assistant:

substr Parser::_finish_filter_arena(substr dst, size_t pos)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= dst.len);
    memcpy(dst.str, m_filter_arena.str, pos);
    return dst.first(pos);
}